

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_t.hpp
# Opt level: O0

void __thiscall
deci_scanner_t::deci_scanner_t(deci_scanner_t *this,istream *input,string *fname,bool interactive)

{
  position local_48 [2];
  byte local_21;
  string *psStack_20;
  bool interactive_local;
  string *fname_local;
  istream *input_local;
  deci_scanner_t *this_local;
  
  local_21 = interactive;
  psStack_20 = fname;
  fname_local = (string *)input;
  input_local = (istream *)this;
  deci_FlexLexer::deci_FlexLexer(&this->super_deci_FlexLexer,input,(ostream *)0x0);
  (this->super_deci_FlexLexer).super_FlexLexer._vptr_FlexLexer =
       (_func_int **)&PTR__deci_scanner_t_0013a2c8;
  std::__cxx11::string::string((string *)&this->fname,(string *)psStack_20);
  deci::position::position(local_48,(filename_type *)0x0,1,1);
  deci::location::location(&this->cloc,local_48);
  this->interactive = (bool)(local_21 & 1);
  deci::location::initialize(&this->cloc,&this->fname,1,1);
  return;
}

Assistant:

deci_scanner_t(std::istream& input, const std::string& fname, bool interactive)
    :deci_FlexLexer(&input),fname(fname),cloc(),interactive(interactive) 
  {
    this->cloc.initialize(&this->fname, 1, 1);
  }